

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loguru.cpp
# Opt level: O3

int loguru::init(EVP_PKEY_CTX *ctx)

{
  byte bVar1;
  ushort uVar2;
  Text TVar3;
  char cVar4;
  int iVar5;
  char *pcVar6;
  char *pcVar7;
  long lVar8;
  size_t __n;
  ctype *pcVar9;
  Text *in_RDX;
  int iVar10;
  uint uVar11;
  char *__s;
  ulong uVar12;
  EVP_PKEY_CTX *pEVar13;
  char *pcVar14;
  undefined8 *in_RSI;
  int iVar15;
  ulong uVar16;
  long lVar17;
  double __x;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double __x_00;
  Text fail_info;
  int local_fc;
  Text str_right;
  Text user_msg;
  Text str_left;
  sigset_t local_c0;
  byte local_40;
  
  pcVar7 = DAT_006811b0;
  if (0 < (long)*(int *)ctx) {
    if (in_RSI[*(int *)ctx] != 0) {
      textprintf((char *)&str_left,"N/A");
      textprintf((char *)&str_right,"N/A");
      textprintf((char *)&fail_info,"CHECK FAILED:  %s %s %s  (%s %s %s)  ","argv[argc]","==",
                 "nullptr",str_left._str,"==",str_right._str);
      textprintf((char *)&user_msg,"Expected proper argc/argv");
      log_and_abort(0,fail_info._str,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/lscpp/external/loguru/loguru.cpp"
                    ,0x216,"%s",user_msg._str);
    }
    pcVar6 = (char *)*in_RSI;
    pcVar14 = (char *)*in_RSI;
    do {
      do {
        __s = pcVar6;
        pcVar6 = pcVar14 + 1;
        cVar4 = *pcVar14;
        pcVar14 = pcVar6;
      } while (cVar4 == '/');
    } while ((cVar4 == '\\') || (pcVar6 = __s, cVar4 != '\0'));
    strlen(__s);
    std::__cxx11::string::_M_replace(0x6811a8,0,pcVar7,(ulong)__s);
    pcVar7 = getcwd(&s_current_dir,0x1000);
    if (pcVar7 == (char *)0x0) {
      errno_as_text();
      TVar3 = str_left;
      iVar15 = s_max_out_verbosity;
      if (s_max_out_verbosity < g_stderr_verbosity) {
        iVar15 = g_stderr_verbosity;
      }
      if (-2 < iVar15) {
        log(__x);
      }
      free(TVar3._str);
    }
    pcVar7 = (char *)0x0;
    std::__cxx11::string::_M_replace(0x6811c8,0,DAT_006811d0,0x54faae);
    local_fc = *(int *)ctx;
    if (0 < local_fc) {
      lVar17 = 0;
      do {
        pcVar7 = (char *)in_RSI[lVar17];
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&str_left,pcVar7,(allocator<char> *)&str_right);
        uVar12 = local_c0.__val[0];
        TVar3 = str_left;
        if (local_c0.__val[0] != 0) {
          uVar16 = 0;
          do {
            bVar1 = TVar3._str[uVar16];
            uVar11 = (uint)bVar1;
            if (0x1f < bVar1) {
              if (bVar1 < 0x27) {
                if (uVar11 == 0x20) {
                  pcVar7 = "\\ ";
                }
                else {
                  if (uVar11 != 0x22) goto switchD_0016f2ef_default;
                  pcVar7 = "\\\"";
                }
              }
              else if (uVar11 == 0x27) {
                pcVar7 = "\\\'";
              }
              else {
                if (uVar11 != 0x5c) goto switchD_0016f2ef_default;
                pcVar7 = "\\\\";
              }
              goto switchD_0016f2ef_caseD_7;
            }
            pcVar7 = "\\a";
            switch(bVar1) {
            case 7:
              break;
            case 8:
              pcVar7 = "\\b";
              break;
            case 9:
              pcVar7 = "\\t";
              break;
            case 10:
              pcVar7 = "\\n";
              break;
            case 0xb:
              pcVar7 = "\\v";
              break;
            case 0xc:
              pcVar7 = "\\f";
              break;
            case 0xd:
              pcVar7 = "\\r";
              break;
            default:
switchD_0016f2ef_default:
              if (bVar1 < 0x20) {
                pcVar7 = "\\x";
                std::__cxx11::string::append((char *)&s_arguments_abi_cxx11_);
                write_hex_digit((string *)(ulong)(bVar1 >> 4),(uint)pcVar7);
                write_hex_digit((string *)(ulong)(uVar11 & 0xf),(uint)pcVar7);
              }
              else {
                pcVar7 = (char *)(ulong)(uint)(int)(char)bVar1;
                std::__cxx11::string::push_back(-0x38);
              }
              goto LAB_0016f36f;
            }
switchD_0016f2ef_caseD_7:
            std::__cxx11::string::append((char *)&s_arguments_abi_cxx11_);
LAB_0016f36f:
            uVar16 = uVar16 + 1;
          } while (uVar12 != uVar16);
        }
        if ((ulong *)str_left._str != local_c0.__val + 1) {
          pcVar7 = (char *)(local_c0.__val[1] + 1);
          operator_delete(str_left._str,(ulong)pcVar7);
        }
        lVar17 = lVar17 + 1;
        local_fc = *(int *)ctx;
        lVar8 = (long)local_fc;
        if (lVar17 < lVar8) {
          pcVar7 = " ";
          std::__cxx11::string::append((char *)&s_arguments_abi_cxx11_);
          local_fc = *(int *)ctx;
          lVar8 = (long)local_fc;
        }
      } while (lVar17 < lVar8);
    }
    if (in_RDX != (Text *)0x0) {
      if (1 < local_fc) {
        iVar15 = 1;
        uVar12 = 1;
        do {
          iVar10 = (int)uVar12;
          pcVar14 = (char *)in_RSI[iVar10];
          __n = strlen((char *)in_RDX);
          pcVar7 = (char *)in_RDX;
          iVar5 = strncmp(pcVar14,(char *)in_RDX,__n);
          if (iVar5 == 0) {
            bVar1 = pcVar14[__n];
            pcVar7 = "";
            std::locale::locale((locale *)&str_left,"");
            pcVar9 = std::use_facet<std::ctype<char>>((locale *)&str_left);
            uVar2 = *(ushort *)(*(long *)(pcVar9 + 0x30) + (ulong)bVar1 * 2);
            std::locale::~locale((locale *)&str_left);
            if ((uVar2 >> 10 & 1) != 0) {
              pcVar14 = (char *)in_RSI[iVar10];
              goto LAB_0016f4d3;
            }
            pcVar14 = pcVar14 + __n;
            cVar4 = *pcVar14;
            if (cVar4 == '\0') {
              uVar11 = iVar10 + 1;
              uVar12 = (ulong)uVar11;
              pcVar14 = (char *)(ulong)*(uint *)ctx;
              if ((int)*(uint *)ctx <= (int)uVar11) goto LAB_0016f8e6;
              pcVar14 = (char *)in_RSI[(int)uVar11];
              local_fc = local_fc + -2;
              cVar4 = *pcVar14;
            }
            else {
              local_fc = local_fc + -1;
            }
            iVar10 = (int)uVar12;
            pEVar13 = (EVP_PKEY_CTX *)(pcVar14 + (cVar4 == '='));
            iVar5 = get_verbosity_from_name((char *)pEVar13);
            if (iVar5 == -10) {
              str_left._str = (char *)0x0;
              pcVar7 = (char *)&str_left;
              lVar17 = strtol((char *)pEVar13,(char **)pcVar7,10);
              g_stderr_verbosity = (int)lVar17;
              if ((str_left._str == (char *)0x0) ||
                 (iVar5 = g_stderr_verbosity, *str_left._str != '\0')) {
                init(pEVar13);
LAB_0016f8e6:
                textprintf((char *)&str_left,"%d",uVar12);
                textprintf((char *)&str_right,"%d",(ulong)pcVar14 & 0xffffffff);
                textprintf((char *)&fail_info,"CHECK FAILED:  %s %s %s  (%s %s %s)  ","arg_it","<",
                           "argc",str_left._str,"<",str_right._str);
                textprintf((char *)&user_msg,"Missing verbosiy level after %s",in_RDX);
                log_and_abort(0,fail_info._str,
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/lscpp/external/loguru/loguru.cpp"
                              ,0x1ab,"%s",user_msg._str);
              }
            }
          }
          else {
LAB_0016f4d3:
            lVar17 = (long)iVar15;
            iVar15 = iVar15 + 1;
            in_RSI[lVar17] = pcVar14;
            iVar5 = g_stderr_verbosity;
          }
          g_stderr_verbosity = iVar5;
          uVar12 = (ulong)(iVar10 + 1U);
        } while ((int)(iVar10 + 1U) < *(int *)ctx);
      }
      *(int *)ctx = local_fc;
      in_RSI[local_fc] = 0;
    }
    set_thread_name("main thread");
    __x_00 = extraout_XMM0_Qa;
    if (-1 < g_stderr_verbosity) {
      if (g_preamble == '\x01') {
        print_preamble_header((char *)&str_left,(size_t)pcVar7);
        if ((g_colorlogtostderr == '\x01') && (s_terminal_has_color == '\x01')) {
          fprintf(_stderr,"%s%s%s\n","\x1b[0m","\x1b[2m",&str_left);
        }
        else {
          fprintf(_stderr,"%s\n",&str_left);
        }
      }
      fflush(_stderr);
      __x_00 = extraout_XMM0_Qa_00;
    }
    iVar15 = s_max_out_verbosity;
    if (s_max_out_verbosity < g_stderr_verbosity) {
      iVar15 = g_stderr_verbosity;
    }
    if (g_internal_verbosity <= iVar15) {
      __x_00 = log(__x_00);
    }
    iVar15 = s_max_out_verbosity;
    if (s_max_out_verbosity < g_stderr_verbosity) {
      iVar15 = g_stderr_verbosity;
    }
    if ((s_current_dir != '\0') && (g_internal_verbosity <= iVar15)) {
      __x_00 = log(__x_00);
    }
    iVar15 = s_max_out_verbosity;
    if (s_max_out_verbosity < g_stderr_verbosity) {
      iVar15 = g_stderr_verbosity;
    }
    if ((g_internal_verbosity <= iVar15) &&
       (__x_00 = log(__x_00), iVar15 = s_max_out_verbosity, s_max_out_verbosity < g_stderr_verbosity
       )) {
      iVar15 = g_stderr_verbosity;
    }
    if (g_internal_verbosity <= iVar15) {
      log(__x_00);
    }
    pEVar13 = (EVP_PKEY_CTX *)0x0;
    memset((sigaction *)&str_left,0,0x98);
    sigemptyset(&local_c0);
    local_40 = local_40 | 4;
    str_left._str = (char *)signal_handler;
    while (iVar15 = sigaction(*(int *)(pEVar13 + 0x670720),(sigaction *)&str_left,(sigaction *)0x0),
          iVar15 != -1) {
      pEVar13 = pEVar13 + 0x10;
      if (pEVar13 == (EVP_PKEY_CTX *)0x70) {
        iVar15 = atexit(on_atexit);
        return iVar15;
      }
    }
    init(pEVar13);
  }
  textprintf((char *)&str_left,"%d");
  textprintf((char *)&str_right,"%d",0);
  textprintf((char *)&fail_info,"CHECK FAILED:  %s %s %s  (%s %s %s)  ","argc",">","0",str_left._str
             ,">",str_right._str);
  textprintf((char *)&user_msg,"Expected proper argc/argv");
  log_and_abort(0,fail_info._str,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/lscpp/external/loguru/loguru.cpp"
                ,0x215,"%s",user_msg._str);
}

Assistant:

void init(int& argc, char* argv[], const char* verbosity_flag)
	{
		CHECK_GT_F(argc,       0,       "Expected proper argc/argv");
		CHECK_EQ_F(argv[argc], nullptr, "Expected proper argc/argv");

		s_argv0_filename = filename(argv[0]);

		#ifdef _WIN32
			#define getcwd _getcwd
		#endif

		if (!getcwd(s_current_dir, sizeof(s_current_dir)))
		{
			const auto error_text = errno_as_text();
			LOG_F(WARNING, "Failed to get current working directory: %s", error_text.c_str());
		}

		s_arguments = "";
		for (int i = 0; i < argc; ++i) {
			escape(s_arguments, argv[i]);
			if (i + 1 < argc) {
				s_arguments += " ";
			}
		}

		if (verbosity_flag) {
			parse_args(argc, argv, verbosity_flag);
		}

		#if LOGURU_PTLS_NAMES || LOGURU_WINTHREADS
			set_thread_name("main thread");
		#elif LOGURU_PTHREADS
			char old_thread_name[16] = {0};
			auto this_thread = pthread_self();
			#if defined(__APPLE__) || defined(__linux__)
				pthread_getname_np(this_thread, old_thread_name, sizeof(old_thread_name));
			#endif
			if (old_thread_name[0] == 0) {
				#ifdef __APPLE__
					pthread_setname_np("main thread");
				#elif defined(__FreeBSD__) || defined(__OpenBSD__)
					pthread_set_name_np(this_thread, "main thread");
				#elif defined(__linux__)
					pthread_setname_np(this_thread, "main thread");
				#endif
			}
		#endif // LOGURU_PTHREADS

		if (g_stderr_verbosity >= Verbosity_INFO) {
			if (g_preamble) {
				char preamble_explain[LOGURU_PREAMBLE_WIDTH];
				print_preamble_header(preamble_explain, sizeof(preamble_explain));
				if (g_colorlogtostderr && s_terminal_has_color) {
					fprintf(stderr, "%s%s%s\n", terminal_reset(), terminal_dim(), preamble_explain);
				} else {
					fprintf(stderr, "%s\n", preamble_explain);
				}
			}
			fflush(stderr);
		}
		VLOG_F(g_internal_verbosity, "arguments: %s", s_arguments.c_str());
		if (strlen(s_current_dir) != 0)
		{
			VLOG_F(g_internal_verbosity, "Current dir: %s", s_current_dir);
		}
		VLOG_F(g_internal_verbosity, "stderr verbosity: %d", g_stderr_verbosity);
		VLOG_F(g_internal_verbosity, "-----------------------------------");

		install_signal_handlers();

		atexit(on_atexit);
	}